

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O1

void CreatePath(char *fn)

{
  int iVar1;
  char *__file;
  char *pcVar2;
  stat info;
  stat sStack_a8;
  
  if ((*fn == '/') && (fn[1] == '\0')) {
    return;
  }
  __file = strdup(fn);
  pcVar2 = __file;
  while( true ) {
    pcVar2 = strchr(pcVar2 + 1,0x2f);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
    }
    iVar1 = stat(__file,&sStack_a8);
    if (((iVar1 != 0) || ((sStack_a8.st_mode._1_1_ & 0x40) == 0)) &&
       (iVar1 = mkdir(__file,0x1ed), iVar1 == -1)) break;
    if (pcVar2 == (char *)0x0) {
      free(__file);
      return;
    }
    *pcVar2 = '/';
  }
  free(__file);
  return;
}

Assistant:

void CreatePath(const char *fn)
{
	char *copy, *p;
 
	if (fn[0] == '/' && fn[1] == '\0')
	{
		return;
	}
	p = copy = strdup(fn);
	do
	{
		p = strchr(p + 1, '/');
		if (p != NULL)
		{
			*p = '\0';
		}
		struct stat info;
		if (stat(copy, &info) == 0)
		{
			if (info.st_mode & S_IFDIR)
				goto exists;
		}
		if (mkdir(copy, 0755) == -1)
		{ // failed
			free(copy);
			return;
		}
exists:	if (p != NULL)
		{
			*p = '/';
		}
	} while (p);
	free(copy);
}